

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlChar * xmlParseAttValueInternal(xmlParserCtxtPtr ctxt,int *len,int *alloc,int normalize)

{
  byte bVar1;
  xmlChar xVar2;
  xmlParserInputPtr pxVar3;
  int *piVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  xmlChar *pxVar8;
  xmlChar *pxVar9;
  xmlEntityPtr pxVar10;
  unsigned_long uVar11;
  xmlChar *pxVar12;
  byte bVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  char *msg;
  int iVar17;
  ulong uVar18;
  xmlParserErrors error;
  byte *pbVar19;
  byte *pbVar20;
  byte *pbVar21;
  ulong uVar22;
  xmlChar xVar23;
  int iVar24;
  ulong uVar25;
  byte *pbVar26;
  byte *pbVar27;
  bool bVar28;
  bool bVar29;
  int local_54;
  xmlChar *local_50;
  int *local_48;
  int *local_40;
  byte *local_38;
  
  uVar6 = 1000000000;
  if ((ctxt->options & 0x80000) == 0) {
    uVar6 = 10000000;
  }
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  pxVar3 = ctxt->input;
  pbVar21 = pxVar3->cur;
  iVar17 = pxVar3->line;
  if ((*pbVar21 == 0x22) || (*pbVar21 == 0x27)) {
    iVar24 = pxVar3->col;
    ctxt->instate = XML_PARSER_ATTRIBUTE_VALUE;
    pbVar20 = pbVar21 + 1;
    bVar1 = *pbVar21;
    pbVar19 = pxVar3->end;
    local_48 = len;
    local_40 = alloc;
    if (pbVar19 <= pbVar20) {
      pxVar8 = pxVar3->base;
      if (((long)pbVar19 - (long)pbVar21 < 0xfa) && (ctxt->progressive == 0)) {
        xmlGROW(ctxt);
      }
      if (ctxt->instate != XML_PARSER_EOF) {
        pbVar19 = ctxt->input->end;
        lVar16 = (long)ctxt->input->base - (long)pxVar8;
        lVar7 = 0;
        if (lVar16 != 0) {
          lVar7 = lVar16;
        }
        pbVar20 = pbVar20 + lVar7;
      }
      if (ctxt->instate == XML_PARSER_EOF) {
        return (xmlChar *)0x0;
      }
    }
    iVar24 = iVar24 + 1;
    if (normalize == 0) {
      pbVar21 = pbVar20;
      if (pbVar20 < pbVar19) {
        do {
          bVar13 = *pbVar21;
          if ((((char)bVar13 < ' ' || bVar13 == bVar1) || (bVar13 == 0x26)) || (bVar13 == 0x3c))
          break;
          pbVar21 = pbVar21 + 1;
          if (pbVar19 <= pbVar21) {
            pxVar3 = ctxt->input;
            pxVar8 = pxVar3->base;
            if ((ctxt->progressive == 0) && ((long)pxVar3->end - (long)pxVar3->cur < 0xfa)) {
              xmlGROW(ctxt);
            }
            if (ctxt->instate == XML_PARSER_EOF) {
LAB_00159717:
              bVar28 = false;
            }
            else {
              pbVar19 = ctxt->input->end;
              lVar16 = (long)ctxt->input->base - (long)pxVar8;
              lVar7 = 0;
              if (lVar16 != 0) {
                lVar7 = lVar16;
              }
              pbVar20 = pbVar20 + lVar7;
              pbVar21 = pbVar21 + lVar7;
              bVar28 = true;
              if ((long)(ulong)uVar6 < (long)pbVar21 - (long)pbVar20) {
                xmlFatalErrMsg(ctxt,XML_ERR_ATTRIBUTE_NOT_FINISHED,"AttValue length too long\n");
                goto LAB_00159717;
              }
            }
            if (!bVar28) {
              return (xmlChar *)0x0;
            }
          }
          iVar24 = iVar24 + 1;
        } while (pbVar21 < pbVar19);
      }
      if ((long)(ulong)uVar6 < (long)pbVar21 - (long)pbVar20) goto LAB_001598eb;
      bVar13 = *pbVar21;
      pbVar27 = pbVar21;
    }
    else {
      if (pbVar20 < pbVar19) {
        do {
          if (((*pbVar20 == bVar1) || (uVar5 = (uint)*pbVar20, 0x20 < uVar5)) ||
             ((0x100002600U >> ((ulong)uVar5 & 0x3f) & 1) == 0)) break;
          iVar24 = iVar24 + 1;
          if (uVar5 == 10) {
            iVar24 = 1;
          }
          pbVar20 = pbVar20 + 1;
          if (pbVar19 <= pbVar20) {
            pxVar3 = ctxt->input;
            pxVar8 = pxVar3->base;
            if ((ctxt->progressive == 0) && ((long)pxVar3->end - (long)pxVar3->cur < 0xfa)) {
              xmlGROW(ctxt);
            }
            if (ctxt->instate != XML_PARSER_EOF) {
              pbVar19 = ctxt->input->end;
              lVar16 = (long)ctxt->input->base - (long)pxVar8;
              lVar7 = 0;
              if (lVar16 != 0) {
                lVar7 = lVar16;
              }
              pbVar20 = pbVar20 + lVar7;
            }
            if (ctxt->instate == XML_PARSER_EOF) {
              return (xmlChar *)0x0;
            }
          }
          iVar17 = iVar17 + (uint)(uVar5 == 10);
        } while (pbVar20 < pbVar19);
      }
      pxVar8 = (xmlChar *)(ulong)uVar6;
      pbVar26 = pbVar20;
      local_50 = pxVar8;
      pbVar27 = pbVar20;
      if (pbVar20 < pbVar19) {
        do {
          bVar13 = *pbVar26;
          pbVar27 = pbVar26;
          if ((((char)bVar13 < ' ' || bVar13 == bVar1) || (bVar13 == 0x26)) || (bVar13 == 0x3c))
          break;
          pbVar27 = pbVar26 + 1;
          if ((bVar13 == 0x20) && (*pbVar27 == 0x20)) {
            iVar24 = iVar24 + 1;
            pbVar26 = pbVar27;
            break;
          }
          if (pbVar19 <= pbVar27) {
            pxVar3 = ctxt->input;
            pxVar9 = pxVar3->base;
            if ((ctxt->progressive == 0) && ((long)pxVar3->end - (long)pxVar3->cur < 0xfa)) {
              xmlGROW(ctxt);
              pxVar8 = local_50;
            }
            if (ctxt->instate == XML_PARSER_EOF) {
LAB_00159613:
              bVar28 = false;
            }
            else {
              pbVar19 = ctxt->input->end;
              lVar16 = (long)ctxt->input->base - (long)pxVar9;
              lVar7 = 0;
              if (lVar16 != 0) {
                lVar7 = lVar16;
              }
              pbVar20 = pbVar20 + lVar7;
              pbVar27 = pbVar27 + lVar7;
              bVar28 = true;
              if ((long)pxVar8 < (long)pbVar27 - (long)pbVar20) {
                xmlFatalErrMsg(ctxt,XML_ERR_ATTRIBUTE_NOT_FINISHED,"AttValue length too long\n");
                pxVar8 = local_50;
                goto LAB_00159613;
              }
            }
            if (!bVar28) {
              return (xmlChar *)0x0;
            }
          }
          iVar24 = iVar24 + 1;
          pbVar26 = pbVar27;
        } while (pbVar27 < pbVar19);
      }
      do {
        pbVar21 = pbVar26;
        if (pbVar21[-1] != 0x20) break;
        pbVar26 = pbVar21 + -1;
      } while (pbVar20 < pbVar21);
      if (pbVar27 < pbVar19) {
        do {
          if (((*pbVar27 == bVar1) || (uVar6 = (uint)*pbVar27, 0x20 < uVar6)) ||
             ((0x100002600U >> ((ulong)uVar6 & 0x3f) & 1) == 0)) break;
          iVar24 = iVar24 + 1;
          if (uVar6 == 10) {
            iVar24 = 1;
          }
          pbVar27 = pbVar27 + 1;
          if (pbVar19 <= pbVar27) {
            pxVar3 = ctxt->input;
            pxVar9 = pxVar3->base;
            if ((ctxt->progressive == 0) && ((long)pxVar3->end - (long)pxVar3->cur < 0xfa)) {
              local_38 = pbVar20;
              xmlGROW(ctxt);
              pbVar20 = local_38;
              pxVar8 = local_50;
            }
            if (ctxt->instate == XML_PARSER_EOF) {
              bVar28 = false;
            }
            else {
              lVar16 = (long)ctxt->input->base - (long)pxVar9;
              lVar7 = 0;
              if (lVar16 != 0) {
                lVar7 = lVar16;
              }
              pbVar19 = ctxt->input->end;
              pbVar21 = pbVar21 + lVar7;
              pbVar20 = pbVar20 + lVar7;
              pbVar27 = pbVar27 + lVar7;
              bVar28 = (long)pbVar27 - (long)pbVar20 <= (long)pxVar8;
              if (!bVar28) {
                xmlFatalErrMsg(ctxt,XML_ERR_ATTRIBUTE_NOT_FINISHED,"AttValue length too long\n");
                pxVar8 = local_50;
              }
            }
            if (!bVar28) {
              return (xmlChar *)0x0;
            }
          }
          iVar17 = iVar17 + (uint)(uVar6 == 10);
        } while (pbVar27 < pbVar19);
      }
      if ((long)pxVar8 < (long)pbVar27 - (long)pbVar20) {
LAB_001598eb:
        xmlFatalErrMsg(ctxt,XML_ERR_ATTRIBUTE_NOT_FINISHED,"AttValue length too long\n");
        return (xmlChar *)0x0;
      }
      bVar13 = *pbVar27;
    }
    if (bVar13 == bVar1) {
      if (local_48 == (int *)0x0) {
        if (local_40 != (int *)0x0) {
          *local_40 = 1;
        }
        pbVar20 = xmlStrndup(pbVar20,(int)pbVar21 - (int)pbVar20);
      }
      else {
        if (local_40 != (int *)0x0) {
          *local_40 = 0;
        }
        *local_48 = (int)pbVar21 - (int)pbVar20;
      }
      pxVar3 = ctxt->input;
      pxVar3->cur = pbVar27 + 1;
      pxVar3->line = iVar17;
      pxVar3->col = iVar24 + 1;
      return pbVar20;
    }
    if (local_40 != (int *)0x0) {
      *local_40 = 1;
    }
    uVar14 = 1000000000;
    if (((uint)ctxt->options >> 0x13 & 1) == 0) {
      uVar14 = 10000000;
    }
    xVar23 = *ctxt->input->cur;
    if (xVar23 != '\"') {
      if (xVar23 != '\'') goto LAB_0015a0e8;
      xVar23 = '\'';
    }
    ctxt->instate = XML_PARSER_ATTRIBUTE_VALUE;
    xmlNextChar(ctxt);
    uVar22 = 100;
    pxVar8 = (xmlChar *)(*xmlMallocAtomic)(100);
    if (pxVar8 == (xmlChar *)0x0) {
      pxVar8 = (xmlChar *)0x0;
    }
    else {
      uVar6 = xmlCurrentChar(ctxt,&local_54);
      bVar28 = false;
      uVar18 = 0;
      do {
        piVar4 = local_48;
        pxVar9 = ctxt->input->cur;
        if (xVar23 == *pxVar9) {
LAB_0015a14b:
          if (ctxt->instate == XML_PARSER_EOF) {
            pbVar21 = (byte *)0x0;
            goto LAB_0015a18f;
          }
          if (((normalize == 0) || (!bVar28)) || (uVar18 == 0)) goto LAB_0015a1e8;
          goto LAB_0015a16e;
        }
        if (0xff < (int)uVar6) {
          if ((0xffefffff < uVar6 - 0x110000 || 0xffffe001 < uVar6 - 0xfffe) || (int)uVar6 < 0xd800)
          goto LAB_00159a1e;
          goto LAB_0015a14b;
        }
        if ((int)uVar6 < 0x20) {
          if ((uVar6 < 0xe) && ((0x2600U >> (uVar6 & 0x1f) & 1) != 0)) goto LAB_00159a1e;
          goto LAB_0015a14b;
        }
        if (uVar6 == 0x3c) goto LAB_0015a14b;
LAB_00159a1e:
        if (ctxt->instate == XML_PARSER_EOF) goto LAB_0015a14b;
        if (uVar6 < 0x27) {
          if ((0x100002600U >> ((ulong)uVar6 & 0x3f) & 1) != 0) {
            if ((normalize == 0) || (uVar18 != 0)) {
              if ((normalize == 0) || (!bVar28)) {
                if (local_54 == 1) {
                  pxVar8[uVar18] = ' ';
                  uVar18 = uVar18 + 1;
                }
                else {
                  iVar17 = xmlCopyCharMultiByte(pxVar8 + uVar18,0x20);
                  uVar18 = uVar18 + (long)iVar17;
                }
                while (uVar22 < uVar18 + 10) {
                  uVar15 = uVar22 * 2 + 10;
                  if (uVar15 < uVar22) {
                    bVar28 = false;
                  }
                  else {
                    pxVar9 = (xmlChar *)(*xmlRealloc)(pxVar8,uVar15);
                    bVar28 = pxVar9 != (xmlChar *)0x0;
                    if (bVar28) {
                      pxVar8 = pxVar9;
                      uVar22 = uVar15;
                    }
                  }
                  if (!bVar28) goto LAB_0015a182;
                }
                bVar28 = true;
              }
              else {
                bVar28 = true;
              }
            }
            else {
              uVar18 = 0;
            }
            goto LAB_00159c4f;
          }
          if ((ulong)uVar6 != 0x26) goto LAB_00159ae8;
          if (pxVar9[1] == '#') {
            iVar17 = xmlParseCharRef(ctxt);
            if (iVar17 == 0) {
              bVar28 = false;
            }
            else {
              uVar15 = uVar18 + 10;
              if (iVar17 == 0x26) {
                if (ctxt->replaceEntities == 0) {
                  if (uVar22 < uVar15) {
                    uVar15 = uVar22 * 2 + 10;
                    if (uVar15 < uVar22) {
                      bVar28 = true;
                      bVar29 = false;
                    }
                    else {
                      pxVar9 = (xmlChar *)(*xmlRealloc)(pxVar8,uVar15);
                      bVar28 = pxVar9 == (xmlChar *)0x0;
                      if (!bVar28) {
                        uVar22 = uVar15;
                      }
                      bVar29 = !bVar28;
                      if (!bVar28) {
                        pxVar8 = pxVar9;
                      }
                    }
                    if (!bVar29) goto LAB_0015a00e;
                  }
                  builtin_memcpy(pxVar8 + uVar18,"&#38;",5);
                  uVar18 = uVar18 + 5;
                }
                else {
                  if (uVar22 < uVar15) {
                    uVar15 = uVar22 * 2 + 10;
                    if (uVar15 < uVar22) {
                      bVar28 = true;
                      bVar29 = false;
                    }
                    else {
                      pxVar9 = (xmlChar *)(*xmlRealloc)(pxVar8,uVar15);
                      bVar28 = pxVar9 == (xmlChar *)0x0;
                      if (!bVar28) {
                        uVar22 = uVar15;
                      }
                      bVar29 = !bVar28;
                      if (!bVar28) {
                        pxVar8 = pxVar9;
                      }
                    }
                    if (!bVar29) goto LAB_0015a00e;
                  }
                  pxVar8[uVar18] = '&';
                  uVar18 = uVar18 + 1;
                }
                bVar28 = false;
              }
              else {
                if (uVar22 < uVar15) {
                  uVar15 = uVar22 * 2 + 10;
                  if (uVar15 < uVar22) {
                    bVar28 = true;
                    bVar29 = false;
                  }
                  else {
                    pxVar9 = (xmlChar *)(*xmlRealloc)(pxVar8,uVar15);
                    bVar28 = pxVar9 == (xmlChar *)0x0;
                    if (!bVar28) {
                      uVar22 = uVar15;
                    }
                    bVar29 = !bVar28;
                    if (!bVar28) {
                      pxVar8 = pxVar9;
                    }
                  }
                  if (!bVar29) goto LAB_0015a00e;
                }
                iVar17 = xmlCopyChar(0,pxVar8 + uVar18,iVar17);
                uVar18 = uVar18 + (long)iVar17;
                bVar28 = false;
              }
            }
LAB_0015a00e:
            if (bVar28) {
              if (!bVar28) {
                return pxVar8;
              }
              goto LAB_0015a182;
            }
            bVar28 = false;
          }
          else {
            pxVar10 = xmlParseEntityRef(ctxt);
            uVar11 = ctxt->nbentities + 1;
            ctxt->nbentities = uVar11;
            bVar28 = false;
            if (pxVar10 != (xmlEntityPtr)0x0) {
              ctxt->nbentities = uVar11 + (long)pxVar10->owner;
              if (pxVar10->etype == XML_INTERNAL_PREDEFINED_ENTITY) {
                if (uVar22 < uVar18 + 10) {
                  uVar15 = uVar22 * 2 + 10;
                  if (uVar15 < uVar22) {
                    bVar29 = false;
                  }
                  else {
                    pxVar9 = (xmlChar *)(*xmlRealloc)(pxVar8,uVar15);
                    bVar29 = pxVar9 != (xmlChar *)0x0;
                    if (bVar29) {
                      pxVar8 = pxVar9;
                      uVar22 = uVar15;
                    }
                  }
                  if (!bVar29) goto LAB_0015a182;
                }
                if ((ctxt->replaceEntities == 0) && (*pxVar10->content == '&')) {
                  builtin_memcpy(pxVar8 + uVar18,"&#38;",5);
                  uVar18 = uVar18 + 5;
                }
                else {
                  pxVar8[uVar18] = *pxVar10->content;
                  uVar18 = uVar18 + 1;
                }
              }
              else {
                if (ctxt->replaceEntities == 0) {
                  iVar17 = xmlStrlen(pxVar10->name);
                  local_50 = pxVar10->name;
                  if (((pxVar10->etype != XML_INTERNAL_PREDEFINED_ENTITY) &&
                      (pxVar9 = pxVar10->content, pxVar9 != (xmlChar *)0x0)) &&
                     (pxVar10->checked == 0)) {
                    uVar11 = ctxt->nbentities;
                    ctxt->depth = ctxt->depth + 1;
                    pxVar9 = xmlStringDecodeEntities(ctxt,pxVar9,1,'\0','\0','\0');
                    ctxt->depth = ctxt->depth + -1;
                    uVar15 = (ctxt->nbentities - uVar11) + 1;
                    if (0x3ffffffe < uVar15) {
                      uVar15 = 0x3fffffff;
                    }
                    pxVar10->checked = (int)uVar15 * 2;
                    if (pxVar9 == (xmlChar *)0x0) {
                      *pxVar10->content = '\0';
                    }
                    else {
                      pxVar12 = xmlStrchr(pxVar9,'<');
                      if (pxVar12 != (xmlChar *)0x0) {
                        *(byte *)&pxVar10->checked = (byte)pxVar10->checked | 1;
                      }
                      (*xmlFree)(pxVar9);
                    }
                  }
                  uVar15 = uVar18 + 1;
                  pxVar8[uVar18] = '&';
                  lVar7 = (long)iVar17 + uVar18;
LAB_0015a04b:
                  if (uVar22 < lVar7 + 0xbU) goto code_r0x0015a050;
                  if (0 < iVar17) {
                    iVar17 = iVar17 + 1;
                    pxVar9 = local_50;
                    do {
                      xVar2 = *pxVar9;
                      pxVar9 = pxVar9 + 1;
                      pxVar8[uVar15] = xVar2;
                      uVar15 = uVar15 + 1;
                      iVar17 = iVar17 + -1;
                    } while (1 < iVar17);
                  }
                  pxVar8[uVar15] = ';';
                  bVar28 = false;
                  uVar18 = uVar15 + 1;
LAB_0015a0cf:
                  if (bVar28) {
                    if (!bVar28) {
                      return pxVar8;
                    }
                    goto LAB_0015a182;
                  }
                  bVar28 = false;
                  goto LAB_00159c7a;
                }
                ctxt->depth = ctxt->depth + 1;
                pbVar21 = xmlStringDecodeEntities(ctxt,pxVar10->content,1,'\0','\0','\0');
                ctxt->depth = ctxt->depth + -1;
                pbVar20 = pbVar21;
                if (pbVar21 != (byte *)0x0) {
                  while( true ) {
                    bVar1 = *pbVar20;
                    bVar13 = 0x20;
                    if (((1 < bVar1 - 9) && (bVar1 != 0xd)) && (bVar13 = bVar1, bVar1 == 0)) break;
                    pxVar8[uVar18] = bVar13;
                    uVar15 = uVar18 + 1;
                    pbVar20 = pbVar20 + 1;
                    uVar25 = uVar18 + 0xb;
                    uVar18 = uVar15;
                    if (uVar22 < uVar25) {
                      uVar15 = uVar22 * 2 + 10;
                      if (uVar15 < uVar22) {
                        bVar28 = false;
                      }
                      else {
                        pxVar9 = (xmlChar *)(*xmlRealloc)(pxVar8,uVar15);
                        bVar28 = pxVar9 != (xmlChar *)0x0;
                        if (bVar28) {
                          pxVar8 = pxVar9;
                          uVar22 = uVar15;
                        }
                      }
                      if (!bVar28) goto LAB_0015a185;
                    }
                  }
                  (*xmlFree)(pbVar21);
                }
                bVar28 = false;
              }
            }
          }
        }
        else {
LAB_00159ae8:
          if (local_54 == 1) {
            pxVar8[uVar18] = (xmlChar)uVar6;
            uVar18 = uVar18 + 1;
          }
          else {
            iVar17 = xmlCopyCharMultiByte(pxVar8 + uVar18,uVar6);
            uVar18 = uVar18 + (long)iVar17;
          }
          bVar28 = false;
          if (uVar22 < uVar18 + 10) {
            uVar15 = uVar22 * 2 + 10;
            bVar28 = false;
            if (uVar15 < uVar22) {
              bVar29 = false;
            }
            else {
              pxVar9 = (xmlChar *)(*xmlRealloc)(pxVar8,uVar15);
              bVar29 = pxVar9 != (xmlChar *)0x0;
              if (bVar29) {
                pxVar8 = pxVar9;
                uVar22 = uVar15;
              }
            }
            if (!bVar29) {
LAB_0015a182:
              pbVar21 = (byte *)0x0;
              goto LAB_0015a185;
            }
          }
LAB_00159c4f:
          pxVar3 = ctxt->input;
          if (*pxVar3->cur == '\n') {
            pxVar3->line = pxVar3->line + 1;
            pxVar3->col = 1;
          }
          else {
            pxVar3->col = pxVar3->col + 1;
          }
          pxVar3->cur = pxVar3->cur + local_54;
        }
LAB_00159c7a:
        if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
          xmlGROW(ctxt);
        }
        uVar6 = xmlCurrentChar(ctxt,&local_54);
      } while (uVar18 <= uVar14);
      xmlFatalErrMsg(ctxt,XML_ERR_ATTRIBUTE_NOT_FINISHED,"AttValue length too long\n");
    }
    pbVar21 = (byte *)0x0;
LAB_0015a185:
    xmlErrMemory(ctxt,(char *)0x0);
LAB_0015a18f:
    if (pxVar8 != (xmlChar *)0x0) {
      (*xmlFree)(pxVar8);
    }
    if (pbVar21 != (byte *)0x0) {
      (*xmlFree)(pbVar21);
    }
  }
  else {
LAB_0015a0e8:
    xmlFatalErr(ctxt,XML_ERR_ATTRIBUTE_NOT_STARTED,(char *)0x0);
  }
  return (xmlChar *)0x0;
code_r0x0015a050:
  uVar18 = (long)iVar17 + 10 + uVar22 * 2;
  if (uVar18 < uVar22) {
    bVar28 = true;
    bVar29 = false;
  }
  else {
    pxVar9 = (xmlChar *)(*xmlRealloc)(pxVar8,uVar18);
    bVar28 = pxVar9 == (xmlChar *)0x0;
    if (!bVar28) {
      uVar22 = uVar18;
    }
    bVar29 = !bVar28;
    if (!bVar28) {
      pxVar8 = pxVar9;
    }
  }
  uVar18 = uVar15;
  if (!bVar29) goto LAB_0015a0cf;
  goto LAB_0015a04b;
  while (uVar18 = uVar18 - 1, uVar18 != 0) {
LAB_0015a16e:
    if (pxVar8[uVar18 - 1] != ' ') goto LAB_0015a1e8;
  }
  uVar18 = 0;
LAB_0015a1e8:
  pxVar8[uVar18] = '\0';
  xVar2 = *ctxt->input->cur;
  if (xVar2 == '<') {
    xmlFatalErr(ctxt,XML_ERR_LT_IN_ATTRIBUTE,(char *)0x0);
    goto LAB_0015a247;
  }
  if (xVar23 == xVar2) {
    xmlNextChar(ctxt);
    goto LAB_0015a247;
  }
  if (uVar6 == 0) {
LAB_0015a236:
    msg = "AttValue: \' expected\n";
    error = XML_ERR_ATTRIBUTE_NOT_FINISHED;
  }
  else {
    if ((int)uVar6 < 0x100) {
      if ((0x1f < (int)uVar6) || ((uVar6 < 0xe && ((0x2600U >> (uVar6 & 0x1f) & 1) != 0))))
      goto LAB_0015a236;
    }
    else if ((uVar6 - 0x10000 < 0x100000 || uVar6 - 0xe000 < 0x1ffe) || (int)uVar6 < 0xd800)
    goto LAB_0015a236;
    msg = "invalid character in attribute value\n";
    error = XML_ERR_INVALID_CHAR;
  }
  xmlFatalErrMsg(ctxt,error,msg);
LAB_0015a247:
  if (piVar4 != (int *)0x0) {
    *piVar4 = (int)uVar18;
    return pxVar8;
  }
  return pxVar8;
}

Assistant:

static xmlChar *
xmlParseAttValueInternal(xmlParserCtxtPtr ctxt, int *len, int *alloc,
                         int normalize)
{
    xmlChar limit = 0;
    const xmlChar *in = NULL, *start, *end, *last;
    xmlChar *ret = NULL;
    int line, col;
    int maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                    XML_MAX_HUGE_LENGTH :
                    XML_MAX_TEXT_LENGTH;

    GROW;
    in = (xmlChar *) CUR_PTR;
    line = ctxt->input->line;
    col = ctxt->input->col;
    if (*in != '"' && *in != '\'') {
        xmlFatalErr(ctxt, XML_ERR_ATTRIBUTE_NOT_STARTED, NULL);
        return (NULL);
    }
    ctxt->instate = XML_PARSER_ATTRIBUTE_VALUE;

    /*
     * try to handle in this routine the most common case where no
     * allocation of a new string is required and where content is
     * pure ASCII.
     */
    limit = *in++;
    col++;
    end = ctxt->input->end;
    start = in;
    if (in >= end) {
        GROW_PARSE_ATT_VALUE_INTERNAL(ctxt, in, start, end)
    }
    if (normalize) {
        /*
	 * Skip any leading spaces
	 */
	while ((in < end) && (*in != limit) &&
	       ((*in == 0x20) || (*in == 0x9) ||
	        (*in == 0xA) || (*in == 0xD))) {
	    if (*in == 0xA) {
	        line++; col = 1;
	    } else {
	        col++;
	    }
	    in++;
	    start = in;
	    if (in >= end) {
                GROW_PARSE_ATT_VALUE_INTERNAL(ctxt, in, start, end)
                if ((in - start) > maxLength) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ATTRIBUTE_NOT_FINISHED,
                                   "AttValue length too long\n");
                    return(NULL);
                }
	    }
	}
	while ((in < end) && (*in != limit) && (*in >= 0x20) &&
	       (*in <= 0x7f) && (*in != '&') && (*in != '<')) {
	    col++;
	    if ((*in++ == 0x20) && (*in == 0x20)) break;
	    if (in >= end) {
                GROW_PARSE_ATT_VALUE_INTERNAL(ctxt, in, start, end)
                if ((in - start) > maxLength) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ATTRIBUTE_NOT_FINISHED,
                                   "AttValue length too long\n");
                    return(NULL);
                }
	    }
	}
	last = in;
	/*
	 * skip the trailing blanks
	 */
	while ((last[-1] == 0x20) && (last > start)) last--;
	while ((in < end) && (*in != limit) &&
	       ((*in == 0x20) || (*in == 0x9) ||
	        (*in == 0xA) || (*in == 0xD))) {
	    if (*in == 0xA) {
	        line++, col = 1;
	    } else {
	        col++;
	    }
	    in++;
	    if (in >= end) {
		const xmlChar *oldbase = ctxt->input->base;
		GROW;
                if (ctxt->instate == XML_PARSER_EOF)
                    return(NULL);
		if (oldbase != ctxt->input->base) {
		    ptrdiff_t delta = ctxt->input->base - oldbase;
		    start = start + delta;
		    in = in + delta;
		    last = last + delta;
		}
		end = ctxt->input->end;
                if ((in - start) > maxLength) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ATTRIBUTE_NOT_FINISHED,
                                   "AttValue length too long\n");
                    return(NULL);
                }
	    }
	}
        if ((in - start) > maxLength) {
            xmlFatalErrMsg(ctxt, XML_ERR_ATTRIBUTE_NOT_FINISHED,
                           "AttValue length too long\n");
            return(NULL);
        }
	if (*in != limit) goto need_complex;
    } else {
	while ((in < end) && (*in != limit) && (*in >= 0x20) &&
	       (*in <= 0x7f) && (*in != '&') && (*in != '<')) {
	    in++;
	    col++;
	    if (in >= end) {
                GROW_PARSE_ATT_VALUE_INTERNAL(ctxt, in, start, end)
                if ((in - start) > maxLength) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ATTRIBUTE_NOT_FINISHED,
                                   "AttValue length too long\n");
                    return(NULL);
                }
	    }
	}
	last = in;
        if ((in - start) > maxLength) {
            xmlFatalErrMsg(ctxt, XML_ERR_ATTRIBUTE_NOT_FINISHED,
                           "AttValue length too long\n");
            return(NULL);
        }
	if (*in != limit) goto need_complex;
    }
    in++;
    col++;
    if (len != NULL) {
        if (alloc) *alloc = 0;
        *len = last - start;
        ret = (xmlChar *) start;
    } else {
        if (alloc) *alloc = 1;
        ret = xmlStrndup(start, last - start);
    }
    CUR_PTR = in;
    ctxt->input->line = line;
    ctxt->input->col = col;
    return ret;
need_complex:
    if (alloc) *alloc = 1;
    return xmlParseAttValueComplex(ctxt, len, normalize);
}